

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O2

AssertionResult __thiscall
testing::internal::
CmpHelperEQ<mp::BasicProblem<mp::BasicProblemParams<int>>::MutLogicalCon,mp::BasicProblem<mp::BasicProblemParams<int>>::BasicLogicalCon<mp::BasicProblem<mp::BasicProblemParams<int>>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>>const>>>
          (internal *this,char *expected_expression,char *actual_expression,MutLogicalCon *expected,
          BasicLogicalCon<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
          *actual)

{
  undefined8 uVar1;
  undefined4 uVar2;
  bool bVar3;
  BasicLogicalCon<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
  *value_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  AssertionResult AVar5;
  BasicLogicalCon<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
  rhs;
  string sStack_68;
  string local_48;
  MutLogicalCon *value;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar4
  ;
  
  uVar1 = (actual->super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>).
          problem_;
  uVar2 = (actual->super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>).
          index_;
  rhs.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_ = uVar2;
  rhs.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_ =
       (BasicProblem<mp::BasicProblemParams<int>_> *)uVar1;
  rhs.super_BasicProblemItem<const_mp::BasicProblem<mp::BasicProblemParams<int>_>_>._12_4_ = 0;
  bVar3 = mp::BasicProblem<mp::BasicProblemParams<int>>::
          BasicLogicalCon<mp::BasicProblem<mp::BasicProblemParams<int>>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>>>>
          ::operator==((BasicLogicalCon<mp::BasicProblem<mp::BasicProblemParams<int>>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>>>>
                        *)expected,rhs);
  if (bVar3) {
    AVar5 = AssertionSuccess();
    sVar4 = AVar5.message_.ptr_;
  }
  else {
    PrintToString<mp::BasicProblem<mp::BasicProblemParams<int>>::MutLogicalCon>
              (&local_48,(testing *)expected,value);
    PrintToString<mp::BasicProblem<mp::BasicProblemParams<int>>::BasicLogicalCon<mp::BasicProblem<mp::BasicProblemParams<int>>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>>const>>>
              (&sStack_68,(testing *)actual,value_00);
    EqFailure(this,expected_expression,actual_expression,&local_48,&sStack_68,false);
    std::__cxx11::string::~string((string *)&sStack_68);
    std::__cxx11::string::~string((string *)&local_48);
    sVar4.ptr_ = extraout_RDX;
  }
  AVar5.message_.ptr_ = sVar4.ptr_;
  AVar5._0_8_ = this;
  return AVar5;
}

Assistant:

AssertionResult CmpHelperEQ(const char* expected_expression,
                            const char* actual_expression,
                            const T1& expected,
                            const T2& actual) {
#ifdef _MSC_VER
# pragma warning(push)          // Saves the current warning state.
# pragma warning(disable:4389)  // Temporarily disables warning on
                                // signed/unsigned mismatch.
#endif

  if (expected == actual) {
    return AssertionSuccess();
  }

#ifdef _MSC_VER
# pragma warning(pop)          // Restores the warning state.
#endif

  return EqFailure(expected_expression,
                   actual_expression,
                   FormatForComparisonFailureMessage(expected, actual),
                   FormatForComparisonFailureMessage(actual, expected),
                   false);
}